

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

char * __thiscall
soul::heart::Printer::PrinterStream::getAssignmentRole(PrinterStream *this,Expression *e)

{
  bool bVar1;
  Variable *this_00;
  pool_ptr<soul::heart::Variable> local_28;
  pool_ptr<soul::heart::Variable> v;
  Expression *e_local;
  PrinterStream *this_local;
  
  v.object = (Variable *)e;
  cast<soul::heart::Variable,soul::heart::Expression>((soul *)&local_28,e);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar1) {
    this_00 = pool_ptr<soul::heart::Variable>::operator->(&local_28);
    bVar1 = Variable::isConstant(this_00);
    if (bVar1) {
      this_local = (PrinterStream *)anon_var_dwarf_dd7f6;
      bVar1 = true;
      goto LAB_0045fd8e;
    }
  }
  bVar1 = false;
LAB_0045fd8e:
  pool_ptr<soul::heart::Variable>::~pool_ptr(&local_28);
  if (!bVar1) {
    this_local = (PrinterStream *)0x4ad301;
  }
  return (char *)this_local;
}

Assistant:

const char* getAssignmentRole (heart::Expression& e)
        {
            if (auto v = cast<heart::Variable> (e))
                if (v->isConstant())
                    return "let ";

            return "";
        }